

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::AsyncStreamFd::writeInternal
          (AsyncStreamFd *this,ArrayPtr<const_unsigned_char> firstPiece,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces,ArrayPtr<const_int> fds)

{
  StringPtr *pSVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  _func_int **pp_Var5;
  SourceLocation location;
  AsyncInputStream AVar6;
  uint i;
  uint uVar7;
  int iVar8;
  iovec *__iovec;
  ArrayPtr<const_unsigned_char> *pAVar9;
  ArrayPtr<const_unsigned_char> *pAVar10;
  void *pvVar11;
  ArrayPtr<const_unsigned_char> *pAVar12;
  long lVar13;
  Exception *count;
  Exception *pEVar14;
  DebugComparison<unsigned_long,_int> *__s;
  ArrayPtr<const_int> *pAVar15;
  ulong uVar16;
  StringPtr *__dest;
  char *pcVar17;
  size_t in_R9;
  ArrayPtr<const_unsigned_char> *pAVar18;
  bool bVar19;
  ArrayPtr<const_unsigned_char> firstPiece_00;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces_00;
  undefined1 local_2b0 [16];
  Disposer *local_2a0;
  Fault f_1;
  ArrayPtr<const_unsigned_char> *local_280;
  Array<void_*> cmsgSpace_heap;
  Array<iovec> iov_heap;
  Fault f;
  AsyncInputStream local_1f0;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_160;
  ArrayPtr<const_int> local_158;
  ArrayPtr<const_int> local_148;
  iovec iov_stack [16];
  
  pcVar17 = (char *)morePieces.size_;
  pAVar12 = morePieces.ptr;
  local_2b0._8_8_ = firstPiece.size_;
  local_2a0 = (Disposer *)firstPiece.ptr;
  pEVar14 = (Exception *)(in_R9 + 1);
  count = (Exception *)0x400;
  if (pEVar14 < (Exception *)0x400) {
    count = pEVar14;
  }
  if (pEVar14 < (Exception *)0x11) {
    iov_heap.ptr = (iovec *)0x0;
    iov_heap.size_ = 0;
    iov_heap.disposer = (ArrayDisposer *)0x0;
    __iovec = iov_stack;
  }
  else {
    __iovec = kj::_::HeapArrayDisposer::allocate<iovec>((size_t)count);
    iov_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    iov_heap.ptr = __iovec;
    iov_heap.size_ = (size_t)count;
  }
  ((iovec *)__iovec)->iov_base = (void *)local_2b0._8_8_;
  ((iovec *)__iovec)->iov_len = (size_t)pAVar12;
  lVar13 = 0x10;
  pAVar18 = pAVar12;
  for (uVar7 = 1; uVar7 < (uint)count; uVar7 = uVar7 + 1) {
    *(undefined8 *)((long)&((iovec *)__iovec)->iov_base + lVar13) =
         *(undefined8 *)(pcVar17 + lVar13 + -0x10);
    lVar4 = *(long *)(pcVar17 + lVar13 + -8);
    *(long *)((long)&((iovec *)__iovec)->iov_len + lVar13) = lVar4;
    pAVar18 = (ArrayPtr<const_unsigned_char> *)((long)&pAVar18->ptr + lVar4);
    lVar13 = lVar13 + 0x10;
  }
  local_280 = pAVar18;
  if (pAVar18 == (ArrayPtr<const_unsigned_char> *)0x0) {
    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
    _kjCondition.left = fds.size_;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = fds.size_ == 0;
    if (fds.size_ != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[30]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x304,FAILED,"fds.size() == 0","_kjCondition,\"can\'t write FDs without bytes\"",
                 &_kjCondition,(char (*) [30])"can\'t write FDs without bytes");
      kj::_::Debug::Fault::fatal(&f);
    }
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    goto LAB_003e79aa;
  }
  if (fds.size_ == 0) {
    do {
      pAVar9 = (ArrayPtr<const_unsigned_char> *)
               writev(*(int *)&local_2a0[2]._vptr_Disposer,(iovec *)__iovec,(uint)count);
      if (-1 < (long)pAVar9) goto LAB_003e773c;
      iVar8 = kj::_::Debug::getOsErrorNumber(true);
    } while (iVar8 == -1);
    if (iVar8 == 0) goto LAB_003e777b;
    f.exception = count;
    kj::_::Debug::Fault::Fault<int,unsigned_long&,unsigned_long>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x30a,iVar8,"n = ::writev(fd, iov.begin(), iov.size())","iovTotal, iov.size()",
               (unsigned_long *)&local_280,(unsigned_long *)&f);
    kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
  }
  else {
    f.exception = (Exception *)0x0;
    uVar3 = fds.size_ * 4 + 7;
    uVar16 = (uVar3 & 0xfffffffffffffff8) + 0x17;
    if (uVar16 < 0x88) {
      cmsgSpace_heap.ptr = (void **)0x0;
      cmsgSpace_heap.size_ = 0;
      cmsgSpace_heap.disposer = (ArrayDisposer *)0x0;
      __s = &_kjCondition;
    }
    else {
      uVar16 = uVar16 >> 3;
      __s = (DebugComparison<unsigned_long,_int> *)kj::_::HeapArrayDisposer::allocate<void*>(uVar16)
      ;
      cmsgSpace_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      cmsgSpace_heap.ptr = (void **)__s;
      cmsgSpace_heap.size_ = uVar16;
    }
    memset(__s,0,(uVar3 & 0xfffffffffffffff8) + 0x10);
    pSVar1 = &__s->op;
    if (0xffffffffffffffef < uVar3) {
      __s = (DebugComparison<unsigned_long,_int> *)0x0;
    }
    *(undefined8 *)&__s->right = 0x100000001;
    __s->left = (unsigned_long)(fds.size_ * 4 + 0x10);
    __dest = (StringPtr *)0x10;
    if (0xffffffffffffffef >= uVar3) {
      __dest = pSVar1;
    }
    memcpy(__dest,fds.ptr,fds.size_ * 4);
    do {
      pAVar9 = (ArrayPtr<const_unsigned_char> *)
               sendmsg(*(int *)&local_2a0[2]._vptr_Disposer,(msghdr *)&f,0);
      if (-1 < (long)pAVar9) goto LAB_003e772d;
      iVar8 = kj::_::Debug::getOsErrorNumber(true);
    } while (iVar8 == -1);
    if (iVar8 == 0) {
LAB_003e772d:
      Array<void_*>::~Array(&cmsgSpace_heap);
      if (-1 < (long)pAVar9) {
LAB_003e773c:
        if (pAVar9 == (ArrayPtr<const_unsigned_char> *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x350,FAILED,(char *)0x0,"\"non-empty sendmsg() returned 0\"",
                     (char (*) [31])"non-empty sendmsg() returned 0");
          kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
        }
        while (pAVar10 = (ArrayPtr<const_unsigned_char> *)((long)pAVar9 - (long)pAVar12),
              pAVar12 <= pAVar9) {
          bVar19 = in_R9 == 0;
          in_R9 = in_R9 - 1;
          if (bVar19) goto LAB_003e787c;
          pAVar18 = (ArrayPtr<const_unsigned_char> *)((long)pAVar18 - (long)pAVar12);
          local_2b0._8_8_ = *(undefined8 *)pcVar17;
          puVar2 = (ulong *)(pcVar17 + 8);
          pcVar17 = pcVar17 + 0x10;
          pAVar9 = pAVar10;
          pAVar12 = (ArrayPtr<const_unsigned_char> *)*puVar2;
        }
        firstPiece_00.size_ = (long)&pAVar9->ptr + local_2b0._8_8_;
        morePieces_00.ptr = (ArrayPtr<const_unsigned_char> *)((long)pAVar12 - (long)pAVar9);
        local_280 = (ArrayPtr<const_unsigned_char> *)((long)pAVar18 - (long)pAVar9);
        pAVar15 = &local_158;
        if (local_280 == (ArrayPtr<const_unsigned_char> *)0x0) {
          pAVar15 = &local_148;
        }
        pAVar15->ptr = (int *)0x0;
        pAVar15->size_ = 0;
        firstPiece_00.ptr = (uchar *)local_2a0;
        morePieces_00.size_ = (size_t)pcVar17;
        writeInternal(this,firstPiece_00,morePieces_00,*pAVar15);
        goto LAB_003e79aa;
      }
LAB_003e777b:
      UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_2b0);
      _kjCondition.left = local_2b0._8_8_;
      _kjCondition._32_8_ = fds.ptr;
      cmsgSpace_heap.ptr =
           (void **)kj::_::
                    SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:833:50)>
                    ::anon_class_56_4_c40b6f0a_for_func::operator();
      pp_Var5 = ((SleepHooks *)&((PromiseArenaMember *)local_2b0._0_8_)->arena)->_vptr_SleepHooks;
      _kjCondition._8_8_ = pAVar12;
      _kjCondition.op.content.ptr = pcVar17;
      _kjCondition.op.content.size_ = in_R9;
      if (pp_Var5 == (_func_int **)0x0 || (ulong)(local_2b0._0_8_ - (long)pp_Var5) < 0x58) {
        pvVar11 = operator_new(0x400);
        pEVar14 = (Exception *)((long)pvVar11 + 0x3a8);
        ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::ArrayPtr<int_const>)::_lambda()_3_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::ArrayPtr<int_const>)::_lambda()_3_,void*&>
                  ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:833:50)>
                    *)pEVar14,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_2b0,
                   (anon_class_56_4_c40b6f0a_for_func *)&_kjCondition,&cmsgSpace_heap.ptr);
        *(void **)((long)pvVar11 + 0x3b0) = pvVar11;
      }
      else {
        ((SleepHooks *)&((PromiseArenaMember *)local_2b0._0_8_)->arena)->_vptr_SleepHooks =
             (_func_int **)0x0;
        pEVar14 = (Exception *)((unsigned_long *)(local_2b0._0_8_ + -0x60) + 1);
        ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::ArrayPtr<int_const>)::_lambda()_3_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::ArrayPtr<int_const>)::_lambda()_3_,void*&>
                  ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:833:50)>
                    *)pEVar14,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_2b0,
                   (anon_class_56_4_c40b6f0a_for_func *)&_kjCondition,&cmsgSpace_heap.ptr);
        *(_func_int ***)(local_2b0._0_8_ + -0x50) = pp_Var5;
      }
      f.exception = (Exception *)&DAT_0042a172;
      location.function = &DAT_0042a1d1;
      location.fileName = &DAT_0042a172;
      location.lineNumber = 0x58b;
      location.columnNumber = 0x4c;
      f_1.exception = pEVar14;
      kj::_::maybeChain<void>((OwnPromiseNode *)&local_1f0,(Promise<void> *)&f_1,location);
      AVar6._vptr_AsyncInputStream = local_1f0._vptr_AsyncInputStream;
      local_1f0._vptr_AsyncInputStream = (_func_int **)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1f0);
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = AVar6._vptr_AsyncInputStream;
      local_160.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_160);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_1);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_2b0);
      goto LAB_003e79aa;
    }
    kj::_::Debug::Fault::Fault
              (&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x32f,iVar8,"n = ::sendmsg(fd, &msg, 0)","");
    kj::_::Debug::Fault::~Fault(&f_1);
    Array<void_*>::~Array(&cmsgSpace_heap);
  }
LAB_003e787c:
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
LAB_003e79aa:
  Array<iovec>::~Array(&iov_heap);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeInternal(ArrayPtr<const byte> firstPiece,
                              ArrayPtr<const ArrayPtr<const byte>> morePieces,
                              ArrayPtr<const int> fds) {
    const size_t iovmax = kj::miniposix::iovMax();
    // If there are more than IOV_MAX pieces, we'll only write the first IOV_MAX for now, and
    // then we'll loop later.
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(1 + morePieces.size(), iovmax), 16, 128);
    size_t iovTotal = 0;

    // writev() interface is not const-correct.  :(
    iov[0].iov_base = const_cast<byte*>(firstPiece.begin());
    iov[0].iov_len = firstPiece.size();
    iovTotal += iov[0].iov_len;
    for (uint i = 1; i < iov.size(); i++) {
      iov[i].iov_base = const_cast<byte*>(morePieces[i - 1].begin());
      iov[i].iov_len = morePieces[i - 1].size();
      iovTotal += iov[i].iov_len;
    }

    if (iovTotal == 0) {
      KJ_REQUIRE(fds.size() == 0, "can't write FDs without bytes");
      return kj::READY_NOW;
    }

    ssize_t n;
    if (fds.size() == 0) {
      KJ_NONBLOCKING_SYSCALL(n = ::writev(fd, iov.begin(), iov.size()), iovTotal, iov.size()) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    } else {
      struct msghdr msg;
      memset(&msg, 0, sizeof(msg));
      msg.msg_iov = iov.begin();
      msg.msg_iovlen = iov.size();

      // Allocate space to send a cmsg.
      size_t msgBytes = CMSG_SPACE(sizeof(int) * fds.size());
      // On Linux, CMSG_SPACE will align to a word-size boundary, but on Mac it always aligns to a
      // 32-bit boundary. I guess aligning to 32 bits helps avoid the problem where you
      // surprisingly end up with space for two file descriptors when you only wanted one. However,
      // cmsghdr's preferred alignment is word-size (it contains a size_t). If we stack-allocate
      // the buffer, we need to make sure it is aligned properly (maybe not on x64, but maybe on
      // other platforms), so we want to allocate an array of words (we use void*). So... we use
      // CMSG_SPACE() and then additionally round up to deal with Mac.
      size_t msgWords = (msgBytes + sizeof(void*) - 1) / sizeof(void*);
      KJ_STACK_ARRAY(void*, cmsgSpace, msgWords, 16, 256);
      auto cmsgBytes = cmsgSpace.asBytes();
      memset(cmsgBytes.begin(), 0, cmsgBytes.size());
      msg.msg_control = cmsgBytes.begin();
      msg.msg_controllen = msgBytes;

      struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg);
      cmsg->cmsg_level = SOL_SOCKET;
      cmsg->cmsg_type = SCM_RIGHTS;
      cmsg->cmsg_len = CMSG_LEN(sizeof(int) * fds.size());
      memcpy(CMSG_DATA(cmsg), fds.begin(), fds.asBytes().size());

      KJ_NONBLOCKING_SYSCALL(n = ::sendmsg(fd, &msg, 0)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    }

    if (false) {
    error:
      return kj::READY_NOW;
    }

    if (n < 0) {
      // Got EAGAIN. Nothing was written.
      return observer.whenBecomesWritable().then([firstPiece, morePieces, fds, this]() {
        return writeInternal(firstPiece, morePieces, fds);
      });
    } else if (n == 0) {
      // Why would a sendmsg() with a non-empty message ever return 0 when writing to a stream
      // socket? If there's no room in the send buffer, it should fail with EAGAIN. If the
      // connection is closed, it should fail with EPIPE. Various documents and forum posts around
      // the internet claim this can happen but no one seems to know when. My guess is it can only
      // happen if we try to send an empty message -- which we didn't. So I think this is
      // impossible. If it is possible, we need to figure out how to correctly handle it, which
      // depends on what caused it.
      //
      // Note in particular that if 0 is a valid return here, and we sent an SCM_RIGHTS message,
      // we need to know whether the message was sent or not, in order to decide whether to retry
      // sending it!
      KJ_FAIL_ASSERT("non-empty sendmsg() returned 0");
    }

    // Non-zero bytes were written. This also implies that *all* FDs were written.

    // Discard all data that was written, then issue a new write for what's left (if any).
    for (;;) {
      if (n < firstPiece.size()) {
        // Only part of the first piece was consumed.  Wait for buffer space and then write again.
        firstPiece = firstPiece.slice(n, firstPiece.size());
        iovTotal -= n;

        if (iovTotal == 0) {
          // Oops, what actually happened is that we hit the IOV_MAX limit. Don't wait.
          return writeInternal(firstPiece, morePieces, nullptr);
        }

        // As with read(), we cannot assume that a short write() really means the write buffer is
        // full (see comments in the read path above). We have to write again.
        return writeInternal(firstPiece, morePieces, nullptr);
      } else if (morePieces.size() == 0) {
        // First piece was fully-consumed and there are no more pieces, so we're done.
        KJ_DASSERT(n == firstPiece.size(), n);
        return READY_NOW;
      } else {
        // First piece was fully consumed, so move on to the next piece.
        n -= firstPiece.size();
        iovTotal -= firstPiece.size();
        firstPiece = morePieces[0];
        morePieces = morePieces.slice(1, morePieces.size());
      }
    }
  }